

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wif.c
# Opt level: O0

int wally_wif_is_uncompressed(char *wif,size_t *written)

{
  uchar local_58 [8];
  uchar buf [38];
  int ret;
  size_t *written_local;
  char *wif_local;
  
  if ((wif == (char *)0x0) || (written == (size_t *)0x0)) {
    wif_local._4_4_ = -2;
  }
  else {
    wif_local._4_4_ = is_uncompressed(wif,local_58,0x26,written);
    wally_clear(local_58,0x26);
  }
  return wif_local._4_4_;
}

Assistant:

int wally_wif_is_uncompressed(const char *wif,
                              size_t *written)
{
    int ret;
    unsigned char buf[2 + EC_PRIVATE_KEY_LEN + BASE58_CHECKSUM_LEN];

    if (!wif || !written)
        return WALLY_EINVAL;

    ret = is_uncompressed(wif, buf, sizeof(buf), written);

    wally_clear(buf, sizeof(buf));
    return ret;
}